

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall Bitmap_Operation::BitmapInfoHeader::BitmapInfoHeader(BitmapInfoHeader *this)

{
  BitmapDibHeader *in_RDI;
  
  BitmapDibHeader::BitmapDibHeader(in_RDI);
  in_RDI->_vptr_BitmapDibHeader = (_func_int **)&PTR__BitmapInfoHeader_0013dd20;
  *(undefined4 *)&in_RDI[1]._vptr_BitmapDibHeader = 0x28;
  *(undefined4 *)((long)&in_RDI[1]._vptr_BitmapDibHeader + 4) = 0;
  *(undefined4 *)&in_RDI[2]._vptr_BitmapDibHeader = 0;
  *(undefined2 *)((long)&in_RDI[2]._vptr_BitmapDibHeader + 4) = 1;
  *(undefined2 *)((long)&in_RDI[2]._vptr_BitmapDibHeader + 6) = 8;
  *(undefined4 *)&in_RDI[3]._vptr_BitmapDibHeader = 0;
  *(undefined4 *)((long)&in_RDI[3]._vptr_BitmapDibHeader + 4) = 0;
  *(undefined4 *)&in_RDI[4]._vptr_BitmapDibHeader = 0;
  *(undefined4 *)((long)&in_RDI[4]._vptr_BitmapDibHeader + 4) = 0;
  *(undefined4 *)&in_RDI[5]._vptr_BitmapDibHeader = 0;
  *(undefined4 *)((long)&in_RDI[5]._vptr_BitmapDibHeader + 4) = 0;
  *(undefined4 *)&in_RDI[6]._vptr_BitmapDibHeader = 0x28;
  return;
}

Assistant:

BitmapInfoHeader()
            : biSize         ( 40 ) // the size of this structure
            , biWidth        ( 0 )  // width of image
            , biHeight       ( 0 )  // height of image
            , biPlanes       ( 1 )  // number of colour planes (always 1)
            , biBitCount     ( 8 )  // bits per pixel
            , biCompress     ( 0 )  // compression type
            , biSizeImage    ( 0 )  // image data size in bytes
            , biXPelsPerMeter( 0 )  // pixels per meter in X direction
            , biYPelsPerMeter( 0 )  // pixels per meter in Y direction
            , biClrUsed      ( 0 )  // Number of colours used
            , biClrImportant ( 0 )  // important colours
            , overallSize    ( 40 ) // real size of this structure for bitmap format
        { }